

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
                 char **param_6)

{
  string *this;
  bool bVar1;
  bool bVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  *pmVar3;
  vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *this_00;
  string *psVar4;
  reference ppcVar5;
  ostream *poVar6;
  char *pcVar7;
  pair<bool,_const_char_*> pVar8;
  byte local_72a;
  byte local_729;
  string local_728;
  string local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  string local_6c8 [32];
  undefined1 local_6a8 [8];
  ostringstream e_2;
  string local_530;
  byte local_510;
  pair<bool,_const_char_*> consistent_2;
  undefined1 local_4e0 [8];
  ostringstream e_1;
  string local_368;
  byte local_348;
  pair<bool,_const_char_*> consistent_1;
  string local_330 [32];
  undefined1 local_310 [8];
  ostringstream e;
  string local_198;
  byte local_178;
  pair<bool,_const_char_*> consistent;
  undefined1 local_148 [8];
  string reportEntry;
  char *ifacePropContent;
  _Self local_118;
  byte local_109;
  cmTarget *pcStack_108;
  bool ifaceIsSet;
  cmTarget *theTarget;
  __normal_iterator<const_cmTarget_*const_*,_std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>_>
  local_f8;
  const_iterator li;
  string interfaceProperty;
  allocator local_99;
  undefined1 local_98 [8];
  string report;
  bool propInitialized;
  vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *deps;
  iterator iStack_60;
  bool impliedByUse;
  _Self local_58;
  byte local_49;
  cmTarget *pcStack_48;
  bool explicitlySet;
  char *propContent;
  char **param_5_local;
  char *pcStack_30;
  CompatibleType t_local;
  char *defaultValue_local;
  string *config_local;
  string *p_local;
  cmTarget *tgt_local;
  
  propContent = (char *)param_6;
  param_5_local._4_4_ = t;
  pcStack_30 = defaultValue;
  defaultValue_local = (char *)config;
  config_local = p;
  p_local = (string *)tgt;
  pcStack_48 = (cmTarget *)getTypedProperty<char_const*>(tgt,p);
  pmVar3 = &cmTarget::GetProperties((cmTarget *)p_local)->
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ;
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
       ::find(pmVar3,config_local);
  pmVar3 = &cmTarget::GetProperties((cmTarget *)p_local)->
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ;
  iStack_60 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              ::end(pmVar3);
  local_49 = std::operator!=(&local_58,&stack0xffffffffffffffa0);
  bVar1 = cmTarget::IsNullImpliedByLinkLibraries((cmTarget *)p_local,config_local);
  local_729 = 1;
  if (bVar1 == (bool)(local_49 & 1)) {
    local_72a = 0;
    if (!bVar1) {
      local_72a = local_49 ^ 0xff;
    }
    local_729 = local_72a;
  }
  if ((local_729 & 1) == 0) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                  ,0x1314,
                  "PropertyType checkInterfacePropertyCompatibility(const cmTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  this_00 = cmTarget::GetLinkImplementationClosure((cmTarget *)p_local,(string *)defaultValue_local)
  ;
  bVar2 = std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::empty(this_00);
  if (bVar2) {
    tgt_local = pcStack_48;
  }
  else {
    report.field_2._M_local_buf[0xf] = local_49 & 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_98," * Target \"",&local_99);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    psVar4 = cmTarget::GetName_abi_cxx11_((cmTarget *)p_local);
    std::__cxx11::string::operator+=((string *)local_98,(string *)psVar4);
    if ((local_49 & 1) == 0) {
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)local_98,"\" property is implied by use.\n");
      }
      else {
        std::__cxx11::string::operator+=((string *)local_98,"\" property not set.\n");
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)local_98,"\" has property content \"");
      valueAsString<char_const*>
                ((string *)((long)&interfaceProperty.field_2 + 8),(char *)pcStack_48);
      std::__cxx11::string::operator+=
                ((string *)local_98,(string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_98,"\"\n");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&li,
                   "INTERFACE_",config_local);
    local_f8._M_current =
         (cmTarget **)
         std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::begin(this_00);
    while( true ) {
      theTarget = (cmTarget *)
                  std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::end(this_00);
      bVar2 = __gnu_cxx::operator!=
                        (&local_f8,
                         (__normal_iterator<const_cmTarget_*const_*,_std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>_>
                          *)&theTarget);
      if (!bVar2) break;
      ppcVar5 = __gnu_cxx::
                __normal_iterator<const_cmTarget_*const_*,_std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>_>
                ::operator*(&local_f8);
      pcStack_108 = *ppcVar5;
      pmVar3 = &cmTarget::GetProperties(pcStack_108)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ;
      local_118._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           ::find(pmVar3,(key_type *)&li);
      pmVar3 = &cmTarget::GetProperties(pcStack_108)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ;
      ifacePropContent =
           (char *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                   ::end(pmVar3);
      local_109 = std::operator!=(&local_118,(_Self *)&ifacePropContent);
      reportEntry.field_2._8_8_ = getTypedProperty<char_const*>(pcStack_108,(string *)&li);
      std::__cxx11::string::string((string *)local_148);
      if ((local_109 & 1) != 0) {
        std::__cxx11::string::operator+=((string *)local_148," * Target \"");
        psVar4 = cmTarget::GetName_abi_cxx11_(pcStack_108);
        std::__cxx11::string::operator+=((string *)local_148,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)local_148,"\" property value \"");
        valueAsString<char_const*>((string *)&consistent.second,(char *)reportEntry.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)local_148,(string *)&consistent.second);
        std::__cxx11::string::~string((string *)&consistent.second);
        std::__cxx11::string::operator+=((string *)local_148,"\" ");
      }
      if ((local_49 & 1) == 0) {
        if (bVar1) {
          pcStack_48 = (cmTarget *)impliedValue<char_const*>((char *)pcStack_48);
          if ((local_109 & 1) == 0) {
            consistent_1.second._4_4_ = 4;
          }
          else {
            pVar8 = consistentProperty<char_const*>
                              ((char *)pcStack_48,(char *)reportEntry.field_2._8_8_,
                               param_5_local._4_4_);
            consistent_1._0_8_ = pVar8.second;
            local_348 = pVar8.first;
            std::__cxx11::string::operator+=((string *)local_98,(string *)local_148);
            compatibilityAgree_abi_cxx11_
                      (&local_368,param_5_local._4_4_,pcStack_48 != (cmTarget *)consistent_1._0_8_);
            std::__cxx11::string::operator+=((string *)local_98,(string *)&local_368);
            std::__cxx11::string::~string((string *)&local_368);
            if ((local_348 & 1) == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e0);
              poVar6 = std::operator<<((ostream *)local_4e0,"Property ");
              poVar6 = std::operator<<(poVar6,(string *)config_local);
              poVar6 = std::operator<<(poVar6," on target \"");
              psVar4 = cmTarget::GetName_abi_cxx11_((cmTarget *)p_local);
              poVar6 = std::operator<<(poVar6,(string *)psVar4);
              poVar6 = std::operator<<(poVar6,"\" is\nimplied to be ");
              poVar6 = std::operator<<(poVar6,pcStack_30);
              poVar6 = std::operator<<(poVar6,
                                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                      );
              poVar6 = std::operator<<(poVar6,(string *)config_local);
              poVar6 = std::operator<<(poVar6," property on\ndependency \"");
              psVar4 = cmTarget::GetName_abi_cxx11_(pcStack_108);
              poVar6 = std::operator<<(poVar6,(string *)psVar4);
              std::operator<<(poVar6,"\" is in conflict.\n");
              std::__cxx11::ostringstream::str();
              pcVar7 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Error(pcVar7,(char *)0x0,(char *)0x0,(char *)0x0);
              std::__cxx11::string::~string((string *)&consistent_2.second);
              consistent_1.second._4_4_ = 2;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e0);
            }
            else {
              pcStack_48 = (cmTarget *)consistent_1._0_8_;
              consistent_1.second._4_4_ = 4;
            }
          }
        }
        else if ((local_109 & 1) == 0) {
          consistent_1.second._4_4_ = 4;
        }
        else if ((report.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::operator+(&local_6e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148,"(Interface set)\n");
          std::__cxx11::string::operator+=((string *)local_98,(string *)&local_6e8);
          std::__cxx11::string::~string((string *)&local_6e8);
          pcStack_48 = (cmTarget *)reportEntry.field_2._8_8_;
          report.field_2._M_local_buf[0xf] = '\x01';
          consistent_1.second._4_4_ = 0;
        }
        else {
          pVar8 = consistentProperty<char_const*>
                            ((char *)pcStack_48,(char *)reportEntry.field_2._8_8_,
                             param_5_local._4_4_);
          consistent_2._0_8_ = pVar8.second;
          local_510 = pVar8.first;
          std::__cxx11::string::operator+=((string *)local_98,(string *)local_148);
          compatibilityAgree_abi_cxx11_
                    (&local_530,param_5_local._4_4_,pcStack_48 != (cmTarget *)consistent_2._0_8_);
          std::__cxx11::string::operator+=((string *)local_98,(string *)&local_530);
          std::__cxx11::string::~string((string *)&local_530);
          if ((local_510 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6a8);
            poVar6 = std::operator<<((ostream *)local_6a8,"The INTERFACE_");
            poVar6 = std::operator<<(poVar6,(string *)config_local);
            poVar6 = std::operator<<(poVar6," property of \"");
            psVar4 = cmTarget::GetName_abi_cxx11_(pcStack_108);
            poVar6 = std::operator<<(poVar6,(string *)psVar4);
            poVar6 = std::operator<<(poVar6,"\" does\nnot agree with the value of ");
            poVar6 = std::operator<<(poVar6,(string *)config_local);
            poVar6 = std::operator<<(poVar6," already determined\nfor \"");
            psVar4 = cmTarget::GetName_abi_cxx11_((cmTarget *)p_local);
            poVar6 = std::operator<<(poVar6,(string *)psVar4);
            std::operator<<(poVar6,"\".\n");
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Error(pcVar7,(char *)0x0,(char *)0x0,(char *)0x0);
            std::__cxx11::string::~string(local_6c8);
            consistent_1.second._4_4_ = 2;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6a8);
          }
          else {
            pcStack_48 = (cmTarget *)consistent_2._0_8_;
            consistent_1.second._4_4_ = 4;
          }
        }
      }
      else if ((local_109 & 1) == 0) {
        consistent_1.second._4_4_ = 4;
      }
      else {
        pVar8 = consistentProperty<char_const*>
                          ((char *)pcStack_48,(char *)reportEntry.field_2._8_8_,param_5_local._4_4_)
        ;
        consistent._0_8_ = pVar8.second;
        local_178 = pVar8.first;
        std::__cxx11::string::operator+=((string *)local_98,(string *)local_148);
        compatibilityAgree_abi_cxx11_
                  (&local_198,param_5_local._4_4_,pcStack_48 != (cmTarget *)consistent._0_8_);
        std::__cxx11::string::operator+=((string *)local_98,(string *)&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        if ((local_178 & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
          poVar6 = std::operator<<((ostream *)local_310,"Property ");
          poVar6 = std::operator<<(poVar6,(string *)config_local);
          poVar6 = std::operator<<(poVar6," on target \"");
          psVar4 = cmTarget::GetName_abi_cxx11_((cmTarget *)p_local);
          poVar6 = std::operator<<(poVar6,(string *)psVar4);
          poVar6 = std::operator<<(poVar6,"\" does\nnot match the INTERFACE_");
          poVar6 = std::operator<<(poVar6,(string *)config_local);
          poVar6 = std::operator<<(poVar6," property requirement\nof dependency \"");
          psVar4 = cmTarget::GetName_abi_cxx11_(pcStack_108);
          poVar6 = std::operator<<(poVar6,(string *)psVar4);
          std::operator<<(poVar6,"\".\n");
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error(pcVar7,(char *)0x0,(char *)0x0,(char *)0x0);
          std::__cxx11::string::~string(local_330);
          consistent_1.second._4_4_ = 2;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
        }
        else {
          pcStack_48 = (cmTarget *)consistent._0_8_;
          consistent_1.second._4_4_ = 4;
        }
      }
      std::__cxx11::string::~string((string *)local_148);
      if ((consistent_1.second._4_4_ != 0) && (consistent_1.second._4_4_ == 2)) break;
      __gnu_cxx::
      __normal_iterator<const_cmTarget_*const_*,_std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>_>
      ::operator++(&local_f8);
    }
    this = p_local;
    psVar4 = config_local;
    valueAsString<char_const*>(&local_708,(char *)pcStack_48);
    compatibilityType_abi_cxx11_(&local_728,param_5_local._4_4_);
    cmTarget::ReportPropertyOrigin((cmTarget *)this,psVar4,&local_708,(string *)local_98,&local_728)
    ;
    std::__cxx11::string::~string((string *)&local_728);
    std::__cxx11::string::~string((string *)&local_708);
    tgt_local = pcStack_48;
    consistent_1.second._4_4_ = 1;
    std::__cxx11::string::~string((string *)&li);
    std::__cxx11::string::~string((string *)local_98);
  }
  return (char *)tgt_local;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmTarget const* tgt,
                                          const std::string &p,
                                          const std::string& config,
                                          const char *defaultValue,
                                          CompatibleType t,
                                          PropertyType *)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);
  const bool explicitlySet = tgt->GetProperties()
                                  .find(p)
                                  != tgt->GetProperties().end();
  const bool impliedByUse =
          tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet)
      || (!impliedByUse && !explicitlySet));

  std::vector<cmTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if(deps.empty())
    {
    return propContent;
    }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet)
    {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
    }
  else if (impliedByUse)
    {
    report += "\" property is implied by use.\n";
    }
  else
    {
    report += "\" property not set.\n";
    }

  std::string interfaceProperty = "INTERFACE_" + p;
  for(std::vector<cmTarget const*>::const_iterator li =
      deps.begin();
      li != deps.end(); ++li)
    {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    cmTarget const* theTarget = *li;

    const bool ifaceIsSet = theTarget->GetProperties()
                            .find(interfaceProperty)
                            != theTarget->GetProperties().end();
    PropertyType ifacePropContent =
                    getTypedProperty<PropertyType>(theTarget,
                              interfaceProperty);

    std::string reportEntry;
    if (ifaceIsSet)
      {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
      }

    if (explicitlySet)
      {
      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" does\nnot match the "
            "INTERFACE_" << p << " property requirement\nof "
            "dependency \"" << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Explicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else if (impliedByUse)
      {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_" << p << " property on\ndependency \""
            << theTarget->GetName() << "\" is in conflict.\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Implicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else
      {
      if (ifaceIsSet)
        {
        if (propInitialized)
          {
          std::pair<bool, PropertyType> consistent =
                                    consistentProperty(propContent,
                                                       ifacePropContent, t);
          report += reportEntry;
          report += compatibilityAgree(t, propContent != consistent.second);
          if (!consistent.first)
            {
            std::ostringstream e;
            e << "The INTERFACE_" << p << " property of \""
              << theTarget->GetName() << "\" does\nnot agree with the value "
                "of " << p << " already determined\nfor \""
              << tgt->GetName() << "\".\n";
            cmSystemTools::Error(e.str().c_str());
            break;
            }
          else
            {
            propContent = consistent.second;
            continue;
            }
          }
        else
          {
          report += reportEntry + "(Interface set)\n";
          propContent = ifacePropContent;
          propInitialized = true;
          }
        }
      else
        {
        // Not set. Nothing to agree on.
        continue;
        }
      }
    }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}